

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall
YAJLFrameHeader::YAJLFrameHeader(YAJLFrameHeader *this,u16 marker,bitio_stream *bstream)

{
  ssize_t sVar1;
  size_t sVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  YAJLFrameHeaderSpec local_38 [2];
  YAJLFrameHeaderSpec spec;
  short local_22;
  u16 length;
  bitio_stream *bstream_local;
  u16 marker_local;
  YAJLFrameHeader *this_local;
  
  std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::vector(&this->specs);
  sVar1 = bitio::bitio_stream::read(bstream,0x10,__buf,in_RCX);
  this->sof = marker;
  sVar2 = bitio::bitio_stream::read
                    (bstream,8,__buf_00,CONCAT62((int6)((ulong)sVar1 >> 0x10),marker));
  this->precision = (u8)sVar2;
  sVar2 = bitio::bitio_stream::read(bstream,0x10,__buf_01,sVar2);
  this->nlines = (u16)sVar2;
  sVar2 = bitio::bitio_stream::read(bstream,0x10,__buf_02,sVar2);
  this->nsamples_per_line = (u16)sVar2;
  sVar3 = bitio::bitio_stream::read(bstream,8,__buf_03,sVar2);
  this->ncomponents = (u8)sVar3;
  for (local_22 = (short)sVar1 + -8; local_22 != 0; local_22 = local_22 + -3) {
    YAJLFrameHeaderSpec::YAJLFrameHeaderSpec(local_38,bstream);
    std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::push_back
              (&this->specs,local_38);
  }
  return;
}

Assistant:

YAJLFrameHeader::YAJLFrameHeader(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    // remove non-recurring lengths.
    length -= 8;

    sof = marker;
    precision = bstream->read(0x8);
    nlines = bstream->read(0x10);
    nsamples_per_line = bstream->read(0x10);
    ncomponents = bstream->read(0x8);

    while (length > 0) {
        YAJLFrameHeaderSpec spec(bstream);
        specs.push_back(spec);
        length -= 3;
    }
}